

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_start(Context *ctx,char *profilestr)

{
  MOJOSHADER_shaderType MVar1;
  int iVar2;
  Buffer *pBVar3;
  char *fmt;
  char *pcVar4;
  char *pcVar5;
  
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    pcVar4 = "fp";
    pcVar5 = "fragment";
  }
  else {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      failf(ctx,"Shader type %u unsupported in this profile.");
      return;
    }
    pcVar4 = "vp";
    pcVar5 = "vertex";
  }
  pBVar3 = ctx->preflight;
  if (pBVar3 == (Buffer *)0x0) {
    pBVar3 = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
    ctx->preflight = pBVar3;
    if (pBVar3 != (Buffer *)0x0) goto LAB_0010d973;
  }
  else {
LAB_0010d973:
    ctx->output = pBVar3;
  }
  iVar2 = strcmp(profilestr,"arb1");
  if (iVar2 == 0) {
    fmt = "!!ARB%s1.0";
  }
  else {
    iVar2 = strcmp(profilestr,"nv2");
    if (iVar2 == 0) {
      ctx->profile_supports_nv2 = 1;
      output_line(ctx,"!!ARB%s1.0",pcVar4);
      fmt = "OPTION NV_%s_program2;";
      pcVar4 = pcVar5;
    }
    else {
      iVar2 = strcmp(profilestr,"nv3");
      if (iVar2 == 0) {
        MVar1 = ctx->shader_type;
        ctx->profile_supports_nv2 = 1;
        ctx->profile_supports_nv3 = 1;
        output_line(ctx,"!!ARB%s1.0",pcVar4);
        output_line(ctx,"OPTION NV_%s_program%d;",pcVar5,(ulong)(MVar1 == MOJOSHADER_TYPE_PIXEL ^ 3)
                   );
        goto LAB_0010da3b;
      }
      iVar2 = strcmp(profilestr,"nv4");
      if (iVar2 != 0) {
        failf(ctx,"Profile \'%s\' unsupported or unknown.",profilestr);
        goto LAB_0010da3b;
      }
      ctx->profile_supports_nv2 = 1;
      ctx->profile_supports_nv3 = 1;
      ctx->profile_supports_nv4 = 1;
      fmt = "!!NV%s4.0";
    }
  }
  output_line(ctx,fmt,pcVar4);
LAB_0010da3b:
  pBVar3 = ctx->mainline;
  if (pBVar3 == (Buffer *)0x0) {
    pBVar3 = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
    ctx->mainline = pBVar3;
    if (pBVar3 == (Buffer *)0x0) {
      return;
    }
  }
  ctx->output = pBVar3;
  return;
}

Assistant:

static void emit_ARB1_start(Context *ctx, const char *profilestr)
{
    const char *shader_str = NULL;
    const char *shader_full_str = NULL;
    if (shader_is_vertex(ctx))
    {
        shader_str = "vp";
        shader_full_str = "vertex";
    } // if
    else if (shader_is_pixel(ctx))
    {
        shader_str = "fp";
        shader_full_str = "fragment";
    } // else if
    else
    {
        failf(ctx, "Shader type %u unsupported in this profile.",
              (uint) ctx->shader_type);
        return;
    } // if

    set_output(ctx, &ctx->preflight);

    if (strcmp(profilestr, MOJOSHADER_PROFILE_ARB1) == 0)
        output_line(ctx, "!!ARB%s1.0", shader_str);

    #if SUPPORT_PROFILE_ARB1_NV
    else if (strcmp(profilestr, MOJOSHADER_PROFILE_NV2) == 0)
    {
        ctx->profile_supports_nv2 = 1;
        output_line(ctx, "!!ARB%s1.0", shader_str);
        output_line(ctx, "OPTION NV_%s_program2;", shader_full_str);
    } // else if

    else if (strcmp(profilestr, MOJOSHADER_PROFILE_NV3) == 0)
    {
        // there's no NV_fragment_program3, so just use 2.
        const int ver = shader_is_pixel(ctx) ? 2 : 3;
        ctx->profile_supports_nv2 = 1;
        ctx->profile_supports_nv3 = 1;
        output_line(ctx, "!!ARB%s1.0", shader_str);
        output_line(ctx, "OPTION NV_%s_program%d;", shader_full_str, ver);
    } // else if

    else if (strcmp(profilestr, MOJOSHADER_PROFILE_NV4) == 0)
    {
        ctx->profile_supports_nv2 = 1;
        ctx->profile_supports_nv3 = 1;
        ctx->profile_supports_nv4 = 1;
        output_line(ctx, "!!NV%s4.0", shader_str);
    } // else if
    #endif

    else
    {
        failf(ctx, "Profile '%s' unsupported or unknown.", profilestr);
    } // else

    set_output(ctx, &ctx->mainline);
}